

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O3

int __thiscall cmsys::RegExpFind::regrepeat(RegExpFind *this,char *p)

{
  long lVar1;
  char cVar2;
  char *pcVar3;
  char *__s;
  char *__s_00;
  size_t sVar4;
  size_t sVar5;
  
  if (5 < (byte)*p - 3) {
switchD_003d781a_caseD_6:
    puts("cm RegularExpression::find(): Internal error.");
    return 0;
  }
  __s_00 = this->reginput;
  __s = p + 3;
  switch((uint)(byte)*p) {
  case 3:
    sVar5 = strlen(__s_00);
    __s_00 = __s_00 + (int)sVar5;
    goto LAB_003d78a0;
  case 4:
    cVar2 = *__s_00;
    if (cVar2 == '\0') {
LAB_003d789d:
      sVar5 = 0;
      goto LAB_003d78a0;
    }
    sVar5 = 0;
    do {
      pcVar3 = strchr(__s,(int)cVar2);
      if (pcVar3 == (char *)0x0) break;
      cVar2 = __s_00[sVar5 + 1];
      sVar5 = sVar5 + 1;
    } while (cVar2 != '\0');
    break;
  case 5:
    cVar2 = *__s_00;
    if (cVar2 == '\0') goto LAB_003d789d;
    sVar5 = 0;
    do {
      pcVar3 = strchr(__s,(int)cVar2);
      if (pcVar3 != (char *)0x0) break;
      cVar2 = __s_00[sVar5 + 1];
      sVar5 = sVar5 + 1;
    } while (cVar2 != '\0');
    break;
  default:
    goto switchD_003d781a_caseD_6;
  case 8:
    if (*__s != *__s_00) goto LAB_003d789d;
    sVar4 = 0;
    do {
      sVar5 = sVar4 + 1;
      lVar1 = sVar4 + 1;
      sVar4 = sVar5;
    } while (*__s == __s_00[lVar1]);
  }
  __s_00 = __s_00 + sVar5;
LAB_003d78a0:
  this->reginput = __s_00;
  return (int)sVar5;
}

Assistant:

int RegExpFind::regrepeat(const char* p)
{
  int count = 0;
  const char* scan;
  const char* opnd;

  scan = reginput;
  opnd = OPERAND(p);
  switch (OP(p)) {
    case ANY:
      count = int(strlen(scan));
      scan += count;
      break;
    case EXACTLY:
      while (*opnd == *scan) {
        count++;
        scan++;
      }
      break;
    case ANYOF:
      while (*scan != '\0' && strchr(opnd, *scan) != KWSYS_NULLPTR) {
        count++;
        scan++;
      }
      break;
    case ANYBUT:
      while (*scan != '\0' && strchr(opnd, *scan) == KWSYS_NULLPTR) {
        count++;
        scan++;
      }
      break;
    default: // Oh dear.  Called inappropriately.
      // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
      printf("cm RegularExpression::find(): Internal error.\n");
      return 0;
  }
  reginput = scan;
  return (count);
}